

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

string * testing::internal::StreamableToString<int>(int *streamable)

{
  Message *in_RSI;
  string *in_RDI;
  string *this;
  Message *this_00;
  Message local_18;
  
  this_00 = &local_18;
  this = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<((Message *)this,(int *)in_RDI);
  Message::GetString_abi_cxx11_(this_00);
  Message::~Message((Message *)0x168bc9);
  return this;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}